

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O0

int tokthfind1(void *ctx0,toksdef *sym,mcmon objn)

{
  char *in_RSI;
  long in_RDI;
  tokseadef *ctx;
  int local_4;
  
  if ((*(short *)(in_RSI + 2) == *(short *)(in_RDI + 10)) && (*in_RSI == *(char *)(in_RDI + 8))) {
    memcpy(*(void **)(in_RDI + 0x38),in_RSI,(ulong)(byte)in_RSI[6] + 8);
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int tokthfind1(void *ctx0, toksdef *sym, mcmon objn)
{
    tokseadef *ctx = (tokseadef *)ctx0;
    
    VARUSED(objn);
    
    if (sym->toksval == ctx->tokseasym.toksval
        && sym->tokstyp == ctx->tokseasym.tokstyp)
    {
        memcpy(ctx->toksearet, sym,
               (size_t)(sizeof(toks1def) + sym->tokslen));
        return(TRUE);
    }
    else
        return(FALSE);
}